

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ae763::GraphEdgeClipper::GatherIncidentEdges
          (GraphEdgeClipper *this,vector<int,_std::allocator<int>_> *a,int ai,
          vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          *b_input_edges,
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          *b_edges)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  _Var4;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  _Var5;
  long lVar6;
  __normal_iterator<const_(anonymous_namespace)::CrossingInputEdge_*,_std::vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>_>
  _Var7;
  EdgeId e;
  InputEdgeId id;
  int local_74;
  value_type local_70;
  vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
  *local_60;
  GraphEdgeClipper *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> *local_48;
  pointer local_40;
  long local_38;
  
  local_60 = b_edges;
  if ((long)(b_input_edges->
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(b_input_edges->
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            )._M_impl.super__Vector_impl_data._M_start >> 2 ==
      ((long)(b_edges->
             super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
      (long)(b_edges->
            super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) / 0x28) {
    local_50 = (long)ai;
    lVar6 = (long)(a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start[local_50];
    local_40 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    piVar3 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (long)piVar3[lVar6 + 1] << 2;
    local_74 = ai;
    local_58 = this;
    local_48 = a;
    for (lVar6 = (long)piVar3[lVar6] << 2; local_38 != lVar6; lVar6 = lVar6 + 4) {
      iVar1 = *(int *)((long)local_40 + lVar6);
      iVar2 = (this->input_ids_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar1];
      _Var4._M_current =
           (b_input_edges->
           super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (b_input_edges->
           super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      id = iVar2;
      _Var7 = std::
              lower_bound<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CrossingInputEdge_const*,std::vector<(anonymous_namespace)::CrossingInputEdge,std::allocator<(anonymous_namespace)::CrossingInputEdge>>>,int>
                        (_Var4,_Var5,&id);
      this = local_58;
      if ((_Var7._M_current != _Var5._M_current) && ((int)*_Var7._M_current >> 1 == iVar2)) {
        local_70.dst = (local_58->g_->edges_->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar1].first;
        local_70.a_index = local_74;
        local_70._8_4_ = local_70._8_4_ & 0xffffff00;
        local_70.id = iVar1;
        absl::
        InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
        ::push_back((local_60->
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start +
                    ((ulong)((long)_Var7._M_current - (long)_Var4._M_current) >> 2),&local_70);
      }
    }
    lVar6 = (long)(local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[local_50];
    piVar3 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[lVar6 + 1];
    for (lVar6 = (long)piVar3[lVar6]; iVar1 != lVar6; lVar6 = lVar6 + 1) {
      iVar2 = (this->input_ids_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar6];
      _Var4._M_current =
           (b_input_edges->
           super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           )._M_impl.super__Vector_impl_data._M_start;
      _Var5._M_current =
           (b_input_edges->
           super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      id = iVar2;
      _Var7 = std::
              lower_bound<__gnu_cxx::__normal_iterator<(anonymous_namespace)::CrossingInputEdge_const*,std::vector<(anonymous_namespace)::CrossingInputEdge,std::allocator<(anonymous_namespace)::CrossingInputEdge>>>,int>
                        (_Var4,_Var5,&id);
      this = local_58;
      if ((_Var7._M_current != _Var5._M_current) && ((int)*_Var7._M_current >> 1 == iVar2)) {
        local_70.dst = (local_58->g_->edges_->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar6].second;
        local_70.id = (EdgeId)lVar6;
        local_70.a_index = local_74;
        local_70.outgoing = true;
        absl::
        InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
        ::push_back((local_60->
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start +
                    ((ulong)((long)_Var7._M_current - (long)_Var4._M_current) >> 2),&local_70);
      }
    }
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x1f1,kFatal,(ostream *)&std::cerr);
  std::operator<<((ostream *)CONCAT44(local_70.dst,local_70._8_4_),
                  "Check failed: (b_input_edges.size()) == (b_edges->size()) ");
  abort();
}

Assistant:

void GraphEdgeClipper::GatherIncidentEdges(
    const vector<VertexId>& a, int ai,
    const vector<CrossingInputEdge>& b_input_edges,
    vector<CrossingGraphEdgeVector>* b_edges) const {
  // Examine all of the edges incident to the given vertex of A.  If any edge
  // comes from a B input edge, append it to the appropriate vector.
  S2_DCHECK_EQ(b_input_edges.size(), b_edges->size());
  for (EdgeId e : in_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, false, g_.edge(e).first));
    }
  }
  for (EdgeId e : out_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, true, g_.edge(e).second));
    }
  }
}